

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_hash_size.hpp
# Opt level: O3

void digestpp::detail::validate_hash_size(size_t hs,size_t max)

{
  runtime_error *this;
  
  if (hs == 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"hash size can\'t be zero");
  }
  else if ((hs & 7) == 0) {
    if (hs <= max) {
      return;
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"invalid hash size");
  }
  else {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"non-byte hash sizes are not supported");
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void validate_hash_size(size_t hs, size_t max)
{
	if (!hs)
		throw std::runtime_error("hash size can't be zero");

	if (hs % 8)
		throw std::runtime_error("non-byte hash sizes are not supported");

	if (hs > max)
		throw std::runtime_error("invalid hash size");
}